

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int yaml_parser_load_mapping(yaml_parser_t *parser,yaml_event_t *first_event)

{
  yaml_node_t *pyVar1;
  yaml_node_pair_t *pyVar2;
  yaml_node_pair_t yVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  yaml_char_t *local_118;
  yaml_char_t *tag;
  yaml_node_pair_t pair;
  int index;
  anon_struct_24_3_654a3493 pairs;
  yaml_node_t node;
  yaml_event_t event;
  yaml_event_t *first_event_local;
  yaml_parser_t *parser_local;
  
  memset(&pair.value,0,0x18);
  local_118 = (first_event->data).scalar.tag;
  if (((long)(parser->document->nodes).top - (long)(parser->document->nodes).start) / 0x60 <
      0x7ffffffe) {
    if ((local_118 == (yaml_char_t *)0x0) || (iVar4 = strcmp((char *)local_118,"!"), iVar4 == 0)) {
      yaml_free(local_118);
      local_118 = yaml_strdup((yaml_char_t *)"tag:yaml.org,2002:map");
      if (local_118 == (yaml_char_t *)0x0) goto LAB_00113acb;
    }
    register0x00000000 = (yaml_node_pair_t *)yaml_malloc(0x80);
    if (register0x00000000 == (yaml_node_pair_t *)0x0) {
      parser->error = YAML_MEMORY_ERROR;
    }
    else {
      pairs.start = register0x00000000 + 0x10;
      pairs.end = register0x00000000;
      memset(&pairs.top,0,0x60);
      pairs.top._0_4_ = 3;
      node._0_8_ = local_118;
      node.data._24_8_ = (first_event->start_mark).index;
      node.start_mark.index = (first_event->start_mark).line;
      node.start_mark.line = (first_event->start_mark).column;
      node.start_mark.column = (first_event->end_mark).index;
      node.end_mark.index = (first_event->end_mark).line;
      node.end_mark.line = (first_event->end_mark).column;
      node.tag = (yaml_char_t *)stack0xffffffffffffff00;
      node.data.mapping.pairs.start = pairs.start;
      node.data.mapping.pairs.end = stack0xffffffffffffff00;
      node.data.scalar.style = *(yaml_scalar_style_t *)((long)&first_event->data + 0x14);
      if (((parser->document->nodes).top != (parser->document->nodes).end) ||
         (iVar4 = yaml_stack_extend((void **)parser->document,&(parser->document->nodes).top,
                                    &(parser->document->nodes).end), iVar4 != 0)) {
        pyVar1 = (parser->document->nodes).top;
        (parser->document->nodes).top = pyVar1 + 1;
        memcpy(pyVar1,&pairs.top,0x60);
        pair.key = (int)(((long)(parser->document->nodes).top -
                         (long)(parser->document->nodes).start) / 0x60);
        iVar4 = yaml_parser_register_anchor(parser,pair.key,(first_event->data).scalar.anchor);
        if (iVar4 == 0) {
          return 0;
        }
        iVar4 = yaml_parser_parse(parser,(yaml_event_t *)&node.end_mark.column);
        if (iVar4 == 0) {
          return 0;
        }
        while( true ) {
          if ((int)node.end_mark.column == 10) {
            pyVar1 = (parser->document->nodes).start;
            iVar4 = pair.key + -1;
            pyVar1[iVar4].end_mark.index = event.start_mark.column;
            pyVar1[iVar4].end_mark.line = event.end_mark.index;
            pyVar1[iVar4].end_mark.column = event.end_mark.line;
            return pair.key;
          }
          if (0x7ffffffd <
              (long)(parser->document->nodes).start[pair.key + -1].data.sequence.items.top -
              (long)(parser->document->nodes).start[pair.key + -1].data.scalar.value >> 3) {
            parser->error = YAML_MEMORY_ERROR;
            return 0;
          }
          iVar4 = yaml_parser_load_node(parser,(yaml_event_t *)&node.end_mark.column);
          if (iVar4 == 0) {
            return 0;
          }
          iVar5 = yaml_parser_parse(parser,(yaml_event_t *)&node.end_mark.column);
          if (iVar5 == 0) break;
          iVar5 = yaml_parser_load_node(parser,(yaml_event_t *)&node.end_mark.column);
          if (iVar5 == 0) {
            return 0;
          }
          if (((parser->document->nodes).start[pair.key + -1].data.sequence.items.top ==
               (yaml_node_item_t *)(parser->document->nodes).start[pair.key + -1].data.scalar.length
              ) && (iVar6 = yaml_stack_extend((void **)&(parser->document->nodes).start
                                                        [pair.key + -1].data,
                                              (void **)((long)&(parser->document->nodes).start
                                                               [pair.key + -1].data + 0x10),
                                              (void **)&(parser->document->nodes).start
                                                        [pair.key + -1].data.scalar.length),
                   iVar6 == 0)) {
            parser->error = YAML_MEMORY_ERROR;
            return 0;
          }
          pyVar1 = (parser->document->nodes).start;
          pyVar2 = pyVar1[pair.key + -1].data.mapping.pairs.top;
          pyVar1[pair.key + -1].data.mapping.pairs.top = pyVar2 + 1;
          yVar3.value = iVar5;
          yVar3.key = iVar4;
          *pyVar2 = yVar3;
          iVar4 = yaml_parser_parse(parser,(yaml_event_t *)&node.end_mark.column);
          if (iVar4 == 0) {
            return 0;
          }
        }
        return 0;
      }
      parser->error = YAML_MEMORY_ERROR;
    }
  }
  else {
    parser->error = YAML_MEMORY_ERROR;
  }
LAB_00113acb:
  yaml_free(local_118);
  yaml_free((first_event->data).document_start.version_directive);
  return 0;
}

Assistant:

static int
yaml_parser_load_mapping(yaml_parser_t *parser, yaml_event_t *first_event)
{
    yaml_event_t event;
    yaml_node_t node;
    struct {
        yaml_node_pair_t *start;
        yaml_node_pair_t *end;
        yaml_node_pair_t *top;
    } pairs = { NULL, NULL, NULL };
    int index;
    yaml_node_pair_t pair;
    yaml_char_t *tag = first_event->data.mapping_start.tag;

    if (!STACK_LIMIT(parser, parser->document->nodes, INT_MAX-1)) goto error;

    if (!tag || strcmp((char *)tag, "!") == 0) {
        yaml_free(tag);
        tag = yaml_strdup((yaml_char_t *)YAML_DEFAULT_MAPPING_TAG);
        if (!tag) goto error;
    }

    if (!STACK_INIT(parser, pairs, yaml_node_pair_t*)) goto error;

    MAPPING_NODE_INIT(node, tag, pairs.start, pairs.end,
            first_event->data.mapping_start.style,
            first_event->start_mark, first_event->end_mark);

    if (!PUSH(parser, parser->document->nodes, node)) goto error;

    index = parser->document->nodes.top - parser->document->nodes.start;

    if (!yaml_parser_register_anchor(parser, index,
                first_event->data.mapping_start.anchor)) return 0;

    if (!yaml_parser_parse(parser, &event)) return 0;

    while (event.type != YAML_MAPPING_END_EVENT) {
        if (!STACK_LIMIT(parser,
                    parser->document->nodes.start[index-1].data.mapping.pairs,
                    INT_MAX-1)) return 0;
        pair.key = yaml_parser_load_node(parser, &event);
        if (!pair.key) return 0;
        if (!yaml_parser_parse(parser, &event)) return 0;
        pair.value = yaml_parser_load_node(parser, &event);
        if (!pair.value) return 0;
        if (!PUSH(parser,
                    parser->document->nodes.start[index-1].data.mapping.pairs,
                    pair)) return 0;
        if (!yaml_parser_parse(parser, &event)) return 0;
    }

    parser->document->nodes.start[index-1].end_mark = event.end_mark;

    return index;

error:
    yaml_free(tag);
    yaml_free(first_event->data.mapping_start.anchor);
    return 0;
}